

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O3

nh_bool find_gend(nh_roles_info *ri,char *gend_str,int *out_gend)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = ri->num_genders;
  if (0 < (long)iVar1) {
    ppcVar2 = ri->gendnames;
    lVar4 = 0;
    do {
      iVar3 = strcmp(gend_str,ppcVar2[lVar4]);
      if (iVar3 == 0) {
        *out_gend = (int)lVar4;
        return '\x01';
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return '\0';
}

Assistant:

static nh_bool find_gend(const struct nh_roles_info *ri,
			 const char *gend_str, int *out_gend)
{
    int i;

    for (i = 0; i < ri->num_genders; i++) {
	if (!strcmp(gend_str, ri->gendnames[i])) {
	    *out_gend = i;
	    return TRUE;
	}
    }
    return FALSE;
}